

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateUniDirectionalLSTMLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  string *this_00;
  int iVar1;
  void *pvVar2;
  bool bVar3;
  LSTMWeightParams *pLVar4;
  LSTMParams *pLVar5;
  long lVar6;
  undefined1 *from;
  InternalMetadata *pIVar7;
  undefined1 *puVar8;
  Result *_result;
  allocator<char> local_112;
  allocator<char> local_111;
  uint64_t local_110;
  string err;
  string local_e8;
  uint64_t local_c8;
  UniDirectionalLSTMLayerParams recurrent;
  string local_70;
  LSTMParams local_50;
  
  validateInputCount(__return_storage_ptr__,layer,1,3);
  bVar3 = Result::good(__return_storage_ptr__);
  if (!bVar3) {
    return __return_storage_ptr__;
  }
  this_00 = &__return_storage_ptr__->m_message;
  std::__cxx11::string::~string((string *)this_00);
  validateOutputCount(__return_storage_ptr__,layer,3,3);
  bVar3 = Result::good(__return_storage_ptr__);
  if (!bVar3) {
    return __return_storage_ptr__;
  }
  std::__cxx11::string::~string((string *)this_00);
  if (this->ndArrayInterpretation == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"UniDirectionalLSTM",(allocator<char> *)&recurrent);
    validateInputOutputRankEquality(__return_storage_ptr__,layer,&local_70,&this->blobNameToRank);
    std::__cxx11::string::~string((string *)&local_70);
    bVar3 = Result::good(__return_storage_ptr__);
    if (!bVar3) {
      return __return_storage_ptr__;
    }
    std::__cxx11::string::~string((string *)this_00);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&recurrent,"UniDirectionalLSTM",(allocator<char> *)&err);
    validateRankCount(__return_storage_ptr__,layer,(string *)&recurrent,5,5,&this->blobNameToRank);
    std::__cxx11::string::~string((string *)&recurrent);
    bVar3 = Result::good(__return_storage_ptr__);
    if (!bVar3) {
      return __return_storage_ptr__;
    }
    std::__cxx11::string::~string((string *)this_00);
  }
  if (layer->_oneof_case_[0] == 0x1a4) {
    puVar8 = *(undefined1 **)&layer->layer_;
  }
  else {
    puVar8 = Specification::_UniDirectionalLSTMLayerParams_default_instance_;
  }
  pIVar7 = &(((BatchnormLayerParams *)puVar8)->mean_->super_MessageLite)._internal_metadata_;
  if (((BatchnormLayerParams *)puVar8)->mean_ == (WeightParams *)0x0) {
    pIVar7 = (InternalMetadata *)0x0;
  }
  iVar1 = *(int *)&(((ConvolutionLayerParams *)puVar8)->kernelsize_).arena_or_elements_;
  for (lVar6 = 0; (long)iVar1 * 8 != lVar6; lVar6 = lVar6 + 8) {
    validateRecurrentActivationParams
              (__return_storage_ptr__,*(ActivationParams **)((long)&pIVar7->ptr_ + lVar6));
    bVar3 = Result::good(__return_storage_ptr__);
    if (!bVar3) {
      return __return_storage_ptr__;
    }
    std::__cxx11::string::~string((string *)this_00);
  }
  if (layer->_oneof_case_[0] == 0x1a4) {
    puVar8 = *(undefined1 **)&layer->layer_;
  }
  else {
    puVar8 = Specification::_UniDirectionalLSTMLayerParams_default_instance_;
  }
  from = (undefined1 *)((UniDirectionalLSTMLayerParams *)puVar8)->params_;
  puVar8 = (undefined1 *)((UniDirectionalLSTMLayerParams *)puVar8)->weightparams_;
  if ((LSTMWeightParams *)puVar8 == (LSTMWeightParams *)0x0) {
    puVar8 = Specification::_LSTMWeightParams_default_instance_;
  }
  if ((LSTMParams *)from == (LSTMParams *)0x0) {
    from = Specification::_LSTMParams_default_instance_;
  }
  Specification::LSTMParams::LSTMParams(&local_50,(LSTMParams *)from);
  validateLSTMWeightParams(__return_storage_ptr__,(LSTMWeightParams *)puVar8,&local_50);
  Specification::LSTMParams::~LSTMParams(&local_50);
  bVar3 = Result::good(__return_storage_ptr__);
  if (!bVar3) {
    return __return_storage_ptr__;
  }
  std::__cxx11::string::~string((string *)this_00);
  if (layer->_oneof_case_[0] == 0x1a4) {
    puVar8 = *(undefined1 **)&layer->layer_;
  }
  else {
    puVar8 = Specification::_UniDirectionalLSTMLayerParams_default_instance_;
  }
  Specification::UniDirectionalLSTMLayerParams::UniDirectionalLSTMLayerParams
            (&recurrent,(UniDirectionalLSTMLayerParams *)puVar8);
  if (recurrent.activations_.super_RepeatedPtrFieldBase.current_size_ == 3) {
    pLVar4 = recurrent.weightparams_;
    if (recurrent.weightparams_ == (LSTMWeightParams *)0x0) {
      pLVar4 = (LSTMWeightParams *)Specification::_LSTMWeightParams_default_instance_;
    }
    local_110 = recurrent.outputvectorsize_;
    puVar8 = (undefined1 *)pLVar4->inputgateweightmatrix_;
    if ((WeightParams *)puVar8 == (WeightParams *)0x0) {
      puVar8 = Specification::_WeightParams_default_instance_;
    }
    local_c8 = recurrent.inputvectorsize_ * recurrent.outputvectorsize_;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&err,"Unidirectional LSTM",&local_111);
    pvVar2 = (layer->name_).tagged_ptr_.ptr_;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"input gate weight matrix",&local_112);
    validateGeneralWeightParams
              (__return_storage_ptr__,(WeightParams *)puVar8,local_c8,local_110,&err,
               (string *)((ulong)pvVar2 & 0xfffffffffffffffe),&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&err);
    bVar3 = Result::good(__return_storage_ptr__);
    if (bVar3) {
      std::__cxx11::string::~string((string *)this_00);
      pLVar4 = recurrent.weightparams_;
      if (recurrent.weightparams_ == (LSTMWeightParams *)0x0) {
        pLVar4 = (LSTMWeightParams *)Specification::_LSTMWeightParams_default_instance_;
      }
      puVar8 = (undefined1 *)pLVar4->forgetgateweightmatrix_;
      if ((WeightParams *)puVar8 == (WeightParams *)0x0) {
        puVar8 = Specification::_WeightParams_default_instance_;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&err,"Unidirectional LSTM",&local_111);
      pvVar2 = (layer->name_).tagged_ptr_.ptr_;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e8,"forget gate weight matrix",&local_112);
      validateGeneralWeightParams
                (__return_storage_ptr__,(WeightParams *)puVar8,local_c8,local_110,&err,
                 (string *)((ulong)pvVar2 & 0xfffffffffffffffe),&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&err);
      bVar3 = Result::good(__return_storage_ptr__);
      if (bVar3) {
        std::__cxx11::string::~string((string *)this_00);
        pLVar4 = recurrent.weightparams_;
        if (recurrent.weightparams_ == (LSTMWeightParams *)0x0) {
          pLVar4 = (LSTMWeightParams *)Specification::_LSTMWeightParams_default_instance_;
        }
        puVar8 = (undefined1 *)pLVar4->blockinputweightmatrix_;
        if ((WeightParams *)puVar8 == (WeightParams *)0x0) {
          puVar8 = Specification::_WeightParams_default_instance_;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&err,"Unidirectional LSTM",&local_111);
        pvVar2 = (layer->name_).tagged_ptr_.ptr_;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e8,"block input gate weight matrix",&local_112);
        validateGeneralWeightParams
                  (__return_storage_ptr__,(WeightParams *)puVar8,local_c8,local_110,&err,
                   (string *)((ulong)pvVar2 & 0xfffffffffffffffe),&local_e8);
        std::__cxx11::string::~string((string *)&local_e8);
        std::__cxx11::string::~string((string *)&err);
        bVar3 = Result::good(__return_storage_ptr__);
        if (bVar3) {
          std::__cxx11::string::~string((string *)this_00);
          pLVar4 = recurrent.weightparams_;
          if (recurrent.weightparams_ == (LSTMWeightParams *)0x0) {
            pLVar4 = (LSTMWeightParams *)Specification::_LSTMWeightParams_default_instance_;
          }
          puVar8 = (undefined1 *)pLVar4->outputgateweightmatrix_;
          if ((WeightParams *)puVar8 == (WeightParams *)0x0) {
            puVar8 = Specification::_WeightParams_default_instance_;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&err,"Unidirectional LSTM",&local_111);
          pvVar2 = (layer->name_).tagged_ptr_.ptr_;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e8,"output gate weight matrix",&local_112);
          validateGeneralWeightParams
                    (__return_storage_ptr__,(WeightParams *)puVar8,local_c8,local_110,&err,
                     (string *)((ulong)pvVar2 & 0xfffffffffffffffe),&local_e8);
          std::__cxx11::string::~string((string *)&local_e8);
          std::__cxx11::string::~string((string *)&err);
          bVar3 = Result::good(__return_storage_ptr__);
          if (bVar3) {
            std::__cxx11::string::~string((string *)this_00);
            pLVar4 = recurrent.weightparams_;
            if (recurrent.weightparams_ == (LSTMWeightParams *)0x0) {
              pLVar4 = (LSTMWeightParams *)Specification::_LSTMWeightParams_default_instance_;
            }
            puVar8 = (undefined1 *)pLVar4->inputgaterecursionmatrix_;
            if ((WeightParams *)puVar8 == (WeightParams *)0x0) {
              puVar8 = Specification::_WeightParams_default_instance_;
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&err,"Unidirectional LSTM",&local_111);
            pvVar2 = (layer->name_).tagged_ptr_.ptr_;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_e8,"input gate recursion matrix",&local_112);
            local_c8 = local_110 * local_110;
            validateGeneralWeightParams
                      (__return_storage_ptr__,(WeightParams *)puVar8,local_c8,local_110,&err,
                       (string *)((ulong)pvVar2 & 0xfffffffffffffffe),&local_e8);
            std::__cxx11::string::~string((string *)&local_e8);
            std::__cxx11::string::~string((string *)&err);
            bVar3 = Result::good(__return_storage_ptr__);
            if (bVar3) {
              std::__cxx11::string::~string((string *)this_00);
              pLVar4 = recurrent.weightparams_;
              if (recurrent.weightparams_ == (LSTMWeightParams *)0x0) {
                pLVar4 = (LSTMWeightParams *)Specification::_LSTMWeightParams_default_instance_;
              }
              puVar8 = (undefined1 *)pLVar4->forgetgaterecursionmatrix_;
              if ((WeightParams *)puVar8 == (WeightParams *)0x0) {
                puVar8 = Specification::_WeightParams_default_instance_;
              }
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&err,"Unidirectional LSTM",&local_111);
              pvVar2 = (layer->name_).tagged_ptr_.ptr_;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_e8,"forget gate recursion matrix",&local_112);
              validateGeneralWeightParams
                        (__return_storage_ptr__,(WeightParams *)puVar8,local_c8,local_110,&err,
                         (string *)((ulong)pvVar2 & 0xfffffffffffffffe),&local_e8);
              std::__cxx11::string::~string((string *)&local_e8);
              std::__cxx11::string::~string((string *)&err);
              bVar3 = Result::good(__return_storage_ptr__);
              if (bVar3) {
                std::__cxx11::string::~string((string *)this_00);
                pLVar4 = recurrent.weightparams_;
                if (recurrent.weightparams_ == (LSTMWeightParams *)0x0) {
                  pLVar4 = (LSTMWeightParams *)Specification::_LSTMWeightParams_default_instance_;
                }
                puVar8 = (undefined1 *)pLVar4->blockinputrecursionmatrix_;
                if ((WeightParams *)puVar8 == (WeightParams *)0x0) {
                  puVar8 = Specification::_WeightParams_default_instance_;
                }
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&err,"Unidirectional LSTM",&local_111);
                pvVar2 = (layer->name_).tagged_ptr_.ptr_;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_e8,"block input gate recursion matrix",&local_112);
                validateGeneralWeightParams
                          (__return_storage_ptr__,(WeightParams *)puVar8,local_c8,local_110,&err,
                           (string *)((ulong)pvVar2 & 0xfffffffffffffffe),&local_e8);
                std::__cxx11::string::~string((string *)&local_e8);
                std::__cxx11::string::~string((string *)&err);
                bVar3 = Result::good(__return_storage_ptr__);
                if (bVar3) {
                  std::__cxx11::string::~string((string *)this_00);
                  pLVar4 = recurrent.weightparams_;
                  if (recurrent.weightparams_ == (LSTMWeightParams *)0x0) {
                    pLVar4 = (LSTMWeightParams *)Specification::_LSTMWeightParams_default_instance_;
                  }
                  puVar8 = (undefined1 *)pLVar4->outputgaterecursionmatrix_;
                  if ((WeightParams *)puVar8 == (WeightParams *)0x0) {
                    puVar8 = Specification::_WeightParams_default_instance_;
                  }
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&err,"Unidirectional LSTM",&local_111);
                  pvVar2 = (layer->name_).tagged_ptr_.ptr_;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_e8,"output gate recursion matrix",&local_112);
                  validateGeneralWeightParams
                            (__return_storage_ptr__,(WeightParams *)puVar8,local_c8,local_110,&err,
                             (string *)((ulong)pvVar2 & 0xfffffffffffffffe),&local_e8);
                  std::__cxx11::string::~string((string *)&local_e8);
                  std::__cxx11::string::~string((string *)&err);
                  bVar3 = Result::good(__return_storage_ptr__);
                  if (bVar3) {
                    std::__cxx11::string::~string((string *)this_00);
                    pLVar5 = recurrent.params_;
                    if (recurrent.params_ == (LSTMParams *)0x0) {
                      pLVar5 = (LSTMParams *)Specification::_LSTMParams_default_instance_;
                    }
                    if (pLVar5->hasbiasvectors_ == true) {
                      pLVar4 = recurrent.weightparams_;
                      if (recurrent.weightparams_ == (LSTMWeightParams *)0x0) {
                        pLVar4 = (LSTMWeightParams *)
                                 Specification::_LSTMWeightParams_default_instance_;
                      }
                      puVar8 = (undefined1 *)pLVar4->inputgatebiasvector_;
                      if ((WeightParams *)puVar8 == (WeightParams *)0x0) {
                        puVar8 = Specification::_WeightParams_default_instance_;
                      }
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&err,"Unidirectional LSTM",&local_111);
                      pvVar2 = (layer->name_).tagged_ptr_.ptr_;
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_e8,"input gate bias vector",&local_112);
                      validateGeneralWeightParams
                                (__return_storage_ptr__,(WeightParams *)puVar8,local_110,1,&err,
                                 (string *)((ulong)pvVar2 & 0xfffffffffffffffe),&local_e8);
                      std::__cxx11::string::~string((string *)&local_e8);
                      std::__cxx11::string::~string((string *)&err);
                      bVar3 = Result::good(__return_storage_ptr__);
                      if (!bVar3) goto LAB_002a8117;
                      std::__cxx11::string::~string((string *)this_00);
                      pLVar4 = recurrent.weightparams_;
                      if (recurrent.weightparams_ == (LSTMWeightParams *)0x0) {
                        pLVar4 = (LSTMWeightParams *)
                                 Specification::_LSTMWeightParams_default_instance_;
                      }
                      puVar8 = (undefined1 *)pLVar4->forgetgatebiasvector_;
                      if ((WeightParams *)puVar8 == (WeightParams *)0x0) {
                        puVar8 = Specification::_WeightParams_default_instance_;
                      }
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&err,"Unidirectional LSTM",&local_111);
                      pvVar2 = (layer->name_).tagged_ptr_.ptr_;
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_e8,"forget gate bias vector",&local_112);
                      validateGeneralWeightParams
                                (__return_storage_ptr__,(WeightParams *)puVar8,local_110,1,&err,
                                 (string *)((ulong)pvVar2 & 0xfffffffffffffffe),&local_e8);
                      std::__cxx11::string::~string((string *)&local_e8);
                      std::__cxx11::string::~string((string *)&err);
                      bVar3 = Result::good(__return_storage_ptr__);
                      if (!bVar3) goto LAB_002a8117;
                      std::__cxx11::string::~string((string *)this_00);
                      pLVar4 = recurrent.weightparams_;
                      if (recurrent.weightparams_ == (LSTMWeightParams *)0x0) {
                        pLVar4 = (LSTMWeightParams *)
                                 Specification::_LSTMWeightParams_default_instance_;
                      }
                      puVar8 = (undefined1 *)pLVar4->blockinputbiasvector_;
                      if ((WeightParams *)puVar8 == (WeightParams *)0x0) {
                        puVar8 = Specification::_WeightParams_default_instance_;
                      }
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&err,"Unidirectional LSTM",&local_111);
                      pvVar2 = (layer->name_).tagged_ptr_.ptr_;
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_e8,"block input bias vector",&local_112);
                      validateGeneralWeightParams
                                (__return_storage_ptr__,(WeightParams *)puVar8,local_110,1,&err,
                                 (string *)((ulong)pvVar2 & 0xfffffffffffffffe),&local_e8);
                      std::__cxx11::string::~string((string *)&local_e8);
                      std::__cxx11::string::~string((string *)&err);
                      bVar3 = Result::good(__return_storage_ptr__);
                      if (!bVar3) goto LAB_002a8117;
                      std::__cxx11::string::~string((string *)this_00);
                      pLVar4 = recurrent.weightparams_;
                      if (recurrent.weightparams_ == (LSTMWeightParams *)0x0) {
                        pLVar4 = (LSTMWeightParams *)
                                 Specification::_LSTMWeightParams_default_instance_;
                      }
                      puVar8 = (undefined1 *)pLVar4->outputgatebiasvector_;
                      if ((WeightParams *)puVar8 == (WeightParams *)0x0) {
                        puVar8 = Specification::_WeightParams_default_instance_;
                      }
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&err,"Unidirectional LSTM",&local_111);
                      pvVar2 = (layer->name_).tagged_ptr_.ptr_;
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_e8,"output gate bias vector",&local_112);
                      validateGeneralWeightParams
                                (__return_storage_ptr__,(WeightParams *)puVar8,local_110,1,&err,
                                 (string *)((ulong)pvVar2 & 0xfffffffffffffffe),&local_e8);
                      std::__cxx11::string::~string((string *)&local_e8);
                      std::__cxx11::string::~string((string *)&err);
                      bVar3 = Result::good(__return_storage_ptr__);
                      if (!bVar3) goto LAB_002a8117;
                      std::__cxx11::string::~string((string *)this_00);
                    }
                    if (recurrent.params_ == (LSTMParams *)0x0) {
                      recurrent.params_ = (LSTMParams *)Specification::_LSTMParams_default_instance_
                      ;
                    }
                    if ((recurrent.params_)->haspeepholevectors_ == true) {
                      pLVar4 = recurrent.weightparams_;
                      if (recurrent.weightparams_ == (LSTMWeightParams *)0x0) {
                        pLVar4 = (LSTMWeightParams *)
                                 Specification::_LSTMWeightParams_default_instance_;
                      }
                      puVar8 = (undefined1 *)pLVar4->inputgatepeepholevector_;
                      if ((WeightParams *)puVar8 == (WeightParams *)0x0) {
                        puVar8 = Specification::_WeightParams_default_instance_;
                      }
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&err,"Unidirectional LSTM",&local_111);
                      pvVar2 = (layer->name_).tagged_ptr_.ptr_;
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_e8,"input gate peep hole vector",&local_112);
                      validateGeneralWeightParams
                                (__return_storage_ptr__,(WeightParams *)puVar8,local_110,1,&err,
                                 (string *)((ulong)pvVar2 & 0xfffffffffffffffe),&local_e8);
                      std::__cxx11::string::~string((string *)&local_e8);
                      std::__cxx11::string::~string((string *)&err);
                      bVar3 = Result::good(__return_storage_ptr__);
                      if (!bVar3) goto LAB_002a8117;
                      std::__cxx11::string::~string((string *)this_00);
                      pLVar4 = recurrent.weightparams_;
                      if (recurrent.weightparams_ == (LSTMWeightParams *)0x0) {
                        pLVar4 = (LSTMWeightParams *)
                                 Specification::_LSTMWeightParams_default_instance_;
                      }
                      puVar8 = (undefined1 *)pLVar4->forgetgatepeepholevector_;
                      if ((WeightParams *)puVar8 == (WeightParams *)0x0) {
                        puVar8 = Specification::_WeightParams_default_instance_;
                      }
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&err,"Unidirectional LSTM",&local_111);
                      pvVar2 = (layer->name_).tagged_ptr_.ptr_;
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_e8,"forget gate peep hole vector",&local_112);
                      validateGeneralWeightParams
                                (__return_storage_ptr__,(WeightParams *)puVar8,local_110,1,&err,
                                 (string *)((ulong)pvVar2 & 0xfffffffffffffffe),&local_e8);
                      std::__cxx11::string::~string((string *)&local_e8);
                      std::__cxx11::string::~string((string *)&err);
                      bVar3 = Result::good(__return_storage_ptr__);
                      if (!bVar3) goto LAB_002a8117;
                      std::__cxx11::string::~string((string *)this_00);
                      if (recurrent.weightparams_ == (LSTMWeightParams *)0x0) {
                        recurrent.weightparams_ =
                             (LSTMWeightParams *)Specification::_LSTMWeightParams_default_instance_;
                      }
                      puVar8 = (undefined1 *)(recurrent.weightparams_)->outputgatepeepholevector_;
                      if ((WeightParams *)puVar8 == (WeightParams *)0x0) {
                        puVar8 = Specification::_WeightParams_default_instance_;
                      }
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&err,"Unidirectional LSTM",&local_111);
                      pvVar2 = (layer->name_).tagged_ptr_.ptr_;
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_e8,"output gate peep hole vector",&local_112);
                      validateGeneralWeightParams
                                (__return_storage_ptr__,(WeightParams *)puVar8,local_110,1,&err,
                                 (string *)((ulong)pvVar2 & 0xfffffffffffffffe),&local_e8);
                      std::__cxx11::string::~string((string *)&local_e8);
                      std::__cxx11::string::~string((string *)&err);
                      bVar3 = Result::good(__return_storage_ptr__);
                      if (!bVar3) goto LAB_002a8117;
                      std::__cxx11::string::~string((string *)this_00);
                    }
                    Result::Result(__return_storage_ptr__);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    std::operator+(&local_e8,"Unidirectional LSTM layer:",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    std::operator+(&err,&local_e8," must provide 3 activations");
    std::__cxx11::string::~string((string *)&local_e8);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
    std::__cxx11::string::~string((string *)&err);
  }
LAB_002a8117:
  Specification::UniDirectionalLSTMLayerParams::~UniDirectionalLSTMLayerParams(&recurrent);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateUniDirectionalLSTMLayer(const Specification::NeuralNetworkLayer& layer) {
    // Must specify hidden states
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 3));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 3, 3));

    if (ndArrayInterpretation) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "UniDirectionalLSTM", blobNameToRank));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "UniDirectionalLSTM", 5, 5, blobNameToRank));
    }

    for (const auto& activation : layer.unidirectionallstm().activations()) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRecurrentActivationParams(activation));
    }

    // Validate common LSTM params and ensure that all weight field types are consistent
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateLSTMWeightParams(layer.unidirectionallstm().weightparams(), layer.unidirectionallstm().params()));

    Specification::UniDirectionalLSTMLayerParams recurrent = layer.unidirectionallstm();
    uint64_t x = recurrent.inputvectorsize();
    uint64_t h = recurrent.outputvectorsize();

    if (recurrent.activations_size() != 3){
        const std::string err = std::string("Unidirectional LSTM layer:" + layer.name() + " must provide 3 activations");
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    // Check weight matrices' sizes
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().inputgateweightmatrix(), h*x, h,
                                                                  "Unidirectional LSTM", layer.name(), "input gate weight matrix"));

    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().forgetgateweightmatrix(), h*x, h,
                                                                  "Unidirectional LSTM", layer.name(), "forget gate weight matrix"));

    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().blockinputweightmatrix(), h*x, h,
                                                                  "Unidirectional LSTM", layer.name(), "block input gate weight matrix"));

    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().outputgateweightmatrix(), h*x, h,
                                                                  "Unidirectional LSTM", layer.name(), "output gate weight matrix"));

    // Check recursion matrices' sizes
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().inputgaterecursionmatrix(), h*h, h,
                                                                  "Unidirectional LSTM", layer.name(), "input gate recursion matrix"));

    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().forgetgaterecursionmatrix(), h*h, h,
                                                                  "Unidirectional LSTM", layer.name(), "forget gate recursion matrix"));

    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().blockinputrecursionmatrix(), h*h, h,
                                                                  "Unidirectional LSTM", layer.name(), "block input gate recursion matrix"));

    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().outputgaterecursionmatrix(), h*h, h,
                                                                  "Unidirectional LSTM", layer.name(), "output gate recursion matrix"));

    // Check bias vectors
    if (recurrent.params().hasbiasvectors()) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().inputgatebiasvector(), h, 1,
                                                                      "Unidirectional LSTM", layer.name(), "input gate bias vector"));

        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().forgetgatebiasvector(), h, 1,
                                                                      "Unidirectional LSTM", layer.name(), "forget gate bias vector"));

        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().blockinputbiasvector(), h, 1,
                                                                      "Unidirectional LSTM", layer.name(), "block input bias vector"));

        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().outputgatebiasvector(), h, 1,
                                                                      "Unidirectional LSTM", layer.name(), "output gate bias vector"));
    }
    // Check peephole vectors
    if (recurrent.params().haspeepholevectors()){
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().inputgatepeepholevector(), h, 1,
                                                                      "Unidirectional LSTM", layer.name(), "input gate peep hole vector"));

        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().forgetgatepeepholevector(), h, 1,
                                                                      "Unidirectional LSTM", layer.name(), "forget gate peep hole vector"));

        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(recurrent.weightparams().outputgatepeepholevector(), h, 1,
                                                                      "Unidirectional LSTM", layer.name(), "output gate peep hole vector"));
    }

    return Result();
}